

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seahash.c
# Opt level: O2

uint64_t seahash(char *key,int len,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  size_t __n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t pad [8];
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  auVar8._8_8_ = 0xb480a793d8e6c86c;
  auVar8._0_8_ = 0xb480a793d8e6c86c;
  auVar6._8_8_ = 0x6eed0e9da4d94a4f;
  auVar6._0_8_ = 0x6eed0e9da4d94a4f;
  local_60 = 0;
  __n = (size_t)(uint)len;
  local_58 = vpinsrq_avx(auVar8,seed ^ 0x16f11fe89b0d677c,0);
  local_48 = _DAT_00198870;
  while (iVar4 = (int)__n, 0x1f < iVar4) {
    auVar8 = *(undefined1 (*) [16])key;
    pauVar1 = (undefined1 (*) [16])((long)key + 0x10);
    key = (char *)((long)key + 0x20);
    __n = __n - 0x20;
    auVar5 = vpmullq_avx512vl(local_58 ^ auVar8,auVar6);
    auVar8 = vpsrlq_avx(auVar5,0x20);
    auVar9 = vpsrlq_avx(auVar5,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar9);
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar5,auVar6);
    auVar5 = vpmullq_avx512vl(local_48 ^ *pauVar1,auVar6);
    auVar8 = vpsrlq_avx(auVar5,0x20);
    auVar9 = vpsrlq_avx(auVar5,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar9);
    local_48 = vpmullq_avx512vl(auVar8 ^ auVar5,auVar6);
  }
  switch(iVar4) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    memcpy(&local_60,key,__n);
    local_60 = local_58._0_8_ ^ local_60;
    goto LAB_0016d36f;
  case 8:
    local_60 = local_58._0_8_ ^ *(ulong *)*(undefined1 (*) [16])key;
LAB_0016d36f:
    local_60 = local_60 * 0x6eed0e9da4d94a4f;
    local_58 = vpinsrq_avx(local_58,((local_60 >> 0x20) >> (local_60 >> 0x3c) ^ local_60) *
                                    0x6eed0e9da4d94a4f,0);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    local_38 = *(undefined8 *)*(undefined1 (*) [16])key;
    uStack_30 = 0;
    memcpy(&local_60,*(undefined1 (*) [16])key + 8,(ulong)(iVar4 - 8));
    auVar2._8_8_ = uStack_30;
    auVar2._0_8_ = local_38;
    auVar12._8_8_ = 0x6eed0e9da4d94a4f;
    auVar12._0_8_ = 0x6eed0e9da4d94a4f;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_60;
    auVar8 = vpunpcklqdq_avx(auVar2,auVar7);
    auVar6 = vpmullq_avx512vl(auVar8 ^ local_58,auVar12);
    auVar8 = vpsrlq_avx(auVar6,0x20);
    auVar5 = vpsrlq_avx(auVar6,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar5);
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar6,auVar12);
    break;
  case 0x10:
    auVar5 = vpmullq_avx512vl(local_58 ^ *(undefined1 (*) [16])key,auVar6);
    auVar8 = vpsrlq_avx(auVar5,0x20);
    auVar9 = vpsrlq_avx(auVar5,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar9);
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar5,auVar6);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    memcpy(&local_60,(undefined1 (*) [16])((long)key + 0x10),(ulong)(iVar4 - 0x10));
    auVar11._8_8_ = 0x6eed0e9da4d94a4f;
    auVar11._0_8_ = 0x6eed0e9da4d94a4f;
    local_60 = local_48._0_8_ ^ local_60;
    auVar6 = vpmullq_avx512vl(local_58 ^ *(undefined1 (*) [16])key,auVar11);
    auVar8 = vpsrlq_avx(auVar6,0x20);
    auVar5 = vpsrlq_avx(auVar6,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar5);
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar6,auVar11);
    goto LAB_0016d3ed;
  case 0x18:
    local_60 = local_48._0_8_ ^ *(ulong *)*(undefined1 (*) [16])((long)key + 0x10);
    auVar5 = vpmullq_avx512vl(local_58 ^ *(undefined1 (*) [16])key,auVar6);
    auVar8 = vpsrlq_avx(auVar5,0x20);
    auVar9 = vpsrlq_avx(auVar5,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar9);
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar5,auVar6);
LAB_0016d3ed:
    local_60 = local_60 * 0x6eed0e9da4d94a4f;
    local_48 = vpinsrq_avx(local_48,((local_60 >> 0x20) >> (local_60 >> 0x3c) ^ local_60) *
                                    0x6eed0e9da4d94a4f,0);
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    local_38 = *(undefined8 *)*(undefined1 (*) [16])((long)key + 0x10);
    uStack_30 = 0;
    memcpy(&local_60,*(undefined1 (*) [16])((long)key + 0x10) + 8,(ulong)(iVar4 - 0x18));
    auVar10._8_8_ = 0x6eed0e9da4d94a4f;
    auVar10._0_8_ = 0x6eed0e9da4d94a4f;
    auVar6 = vpmullq_avx512vl(local_58 ^ *(undefined1 (*) [16])key,auVar10);
    auVar8 = vpsrlq_avx(auVar6,0x20);
    auVar5 = vpsrlq_avx(auVar6,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar5);
    auVar5._8_8_ = uStack_30;
    auVar5._0_8_ = local_38;
    local_58 = vpmullq_avx512vl(auVar8 ^ auVar6,auVar10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_60;
    auVar8 = vpunpcklqdq_avx(auVar5,auVar9);
    auVar6 = vpmullq_avx512vl(auVar8 ^ local_48,auVar10);
    auVar8 = vpsrlq_avx(auVar6,0x20);
    auVar5 = vpsrlq_avx(auVar6,0x3c);
    auVar8 = vpsrlvq_avx2(auVar8,auVar5);
    local_48 = vpmullq_avx512vl(auVar8 ^ auVar6,auVar10);
  }
  auVar8 = vpshufd_avx(local_58,0x4e);
  auVar6 = vpshufd_avx(auVar8 ^ local_48,0xee);
  uVar3 = (SUB168(auVar8 ^ local_48,0) ^ auVar6._0_8_ ^ (long)len) * 0x6eed0e9da4d94a4f;
  uVar3 = ((uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3) * 0x6eed0e9da4d94a4f;
  return uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
}

Assistant:

uint64_t seahash(const char *key, int len, uint64_t seed) {
  uint64_t a, b, c, d;
  uint64_t s = seed;
  uint64_t *p;
  uint8_t pad[8] = {0};
  const uint64_t orig_len = (uint64_t)len;

  a = 0x16f11fe89b0d677cULL ^ s;
  b = 0xb480a793d8e6c86cULL;
  c = 0x6fe2e5aaf078ebc9ULL;
  d = 0x14f994a4c5259381ULL;

  p = (uint64_t *)key;
  while (len >= 32) {
    a ^= *p++;
    b ^= *p++;
    c ^= *p++;
    d ^= *p++;
    a = diffuse(a);
    b = diffuse(b);
    c = diffuse(c);
    d = diffuse(d);
    len -= 32;
  }

  switch (len) {
    // illegal msvc 15 syntax
    case 25 ... 31:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      memcpy(pad, p, len - 24);
      d ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      d = diffuse(d);
      break;
    case 24:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 17 ... 23:
      a ^= *p++;
      b ^= *p++;
      memcpy(pad, p, len - 16);
      c ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 16:
      a ^= *p++;
      b ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 9 ... 15:
      a ^= *p++;
      memcpy(pad, p, len - 8);
      b ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 8:
      a ^= *p++;
      a = diffuse(a);
      break;
    case 1 ... 7:
      memcpy(pad, p, len);
      a ^= *(uint64_t *)pad;
      a = diffuse(a);
      break;
    case 0:
      break;
    default:
      assert(0);
  }

  a ^= b;
  c ^= d;
  a ^= c;
  a ^= orig_len;
  return sea_swap64(diffuse(a));
}